

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

int sptk::NextPowTwo(int num)

{
  uint uVar1;
  
  uVar1 = (int)(num - 1U) >> 1 | num - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  return ((int)uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

int NextPowTwo(int num) {
  num--;
  num |= num >> 1;
  num |= num >> 2;
  num |= num >> 4;
  num |= num >> 8;
  num |= num >> 16;
  num++;
  return num;
}